

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

void __thiscall optimization::graph_color::Conflict_Map::remove_edge_less_colors(Conflict_Map *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  iterator iter;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  vars_to_remove;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_70;
  VarId local_40;
  
  if ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var2 = &local_70._M_impl.super__Rb_tree_header;
    p_Var1 = &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      if (this->color_num <= p_Var3[1]._M_color) {
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_70);
        return;
      }
      if ((_Rb_tree_header *)p_Var3 != p_Var1) {
        do {
          p_Var4 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
          if (this->color_num <= p_Var3[1]._M_color) break;
          std::
          _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                    ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                      *)&local_70,*(_Base_ptr *)(p_Var3 + 2),
                     (_Rb_tree_const_iterator<mir::inst::VarId>)&p_Var3[1]._M_left);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          p_Var4 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
        } while ((_Rb_tree_header *)p_Var3 != p_Var1);
        for (; (_Rb_tree_header *)p_Var4 != p_Var2;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          local_40.id = *(uint32_t *)&p_Var4[1]._M_parent;
          local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          remove_node(this,&local_40,true);
        }
      }
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree(&local_70);
    } while ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  return;
}

Assistant:

void remove_edge_less_colors() {
    while (true) {
      if (!edge_vars.size()) {
        return;
      }
      auto min_edge_iter = edge_vars.begin();
      auto min_edge = min_edge_iter->first;
      std::set<mir::inst::VarId> vars_to_remove;
      if (min_edge >= color_num) {
        return;
      }
      for (auto iter = edge_vars.begin();
           iter != edge_vars.end() && iter->first < color_num; ++iter) {
        vars_to_remove.insert(iter->second.begin(), iter->second.end());
      }
      for (auto var : vars_to_remove) {
        remove_node(var);
      }
    }
  }